

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O3

int32_t __thiscall
llama_vocab::impl::detokenize
          (impl *this,llama_token *tokens,int32_t n_tokens,char *text,int32_t text_len_max,
          bool remove_special,bool unparse_special)

{
  uint uVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  long lVar8;
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int32_t length;
  ulong uVar14;
  
  if (this->type == LLAMA_VOCAB_TYPE_NONE) {
    return 0;
  }
  if ((this->tokenizer)._M_t.
      super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>._M_t.
      super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
      super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl == (llm_tokenizer *)0x0) {
    pcVar6 = "tokenizer && \"Tokenizer not initialized. Call llama_vocab::init_tokenizer() first.\""
    ;
    uVar9 = 0xa4f;
LAB_00217b47:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
               ,uVar9,"GGML_ASSERT(%s) failed",pcVar6);
  }
  bVar3 = this->add_space_prefix;
  uVar4 = n_tokens;
  if (remove_special) {
    if (((0 < n_tokens) && (this->add_bos != false)) && (*tokens == this->special_bos_id)) {
      n_tokens = n_tokens - 1;
      tokens = tokens + 1;
      bVar3 = 0;
    }
    uVar4 = n_tokens;
    if (((0 < n_tokens & this->add_eos) != 1) ||
       (uVar4 = n_tokens - 1U, tokens[n_tokens - 1U] == this->special_eos_id)) goto LAB_002178fa;
LAB_00217900:
    uVar4 = (uint)bVar3;
    uVar14 = 0;
    uVar13 = 0;
    length = text_len_max;
    do {
      if (length < 0) {
        pcVar6 = "avail >= 0";
        uVar9 = 0xa66;
        goto LAB_00217b47;
      }
      uVar4 = token_to_piece(this,tokens[uVar14],text,length,uVar4,unparse_special);
      if ((int)uVar4 < 0) {
        uVar13 = (ulong)((int)uVar13 - uVar4);
        length = 0;
      }
      else if (uVar4 != 0) {
        length = length - uVar4;
        text = text + uVar4;
        uVar13 = (ulong)((int)uVar13 + uVar4);
      }
      uVar14 = uVar14 + 1;
      uVar4 = 0;
    } while ((uint)n_tokens != uVar14);
  }
  else {
LAB_002178fa:
    n_tokens = uVar4;
    if (0 < n_tokens) goto LAB_00217900;
    uVar13 = 0;
  }
  uVar4 = (uint)uVar13;
  if (text_len_max < (int)uVar4) {
    return -uVar4;
  }
  if (this->clean_spaces == true) {
    if (1 < (int)uVar4) {
      lVar8 = 1 - uVar13;
      uVar4 = (uint)(uVar4 != 0);
      do {
        uVar5 = uVar4;
        bVar3 = text[lVar8];
        if (((text[lVar8 + -1] == ' ') && (bVar3 < 0x40)) &&
           ((0x8000500200000000U >> ((ulong)(uint)bVar3 & 0x3f) & 1) != 0)) {
          uVar5 = uVar5 - 1;
        }
        uVar4 = uVar5 + 1;
        text[(long)(int)uVar5 - uVar13] = bVar3;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
      if (0 < (int)uVar5) {
        uVar14 = (ulong)(uVar4 != 0);
        iVar10 = 1;
        do {
          lVar8 = (long)iVar10;
          cVar2 = text[lVar8 - uVar13];
          iVar7 = (int)uVar14;
          iVar11 = iVar10;
          if ((((cVar2 == '\'') && (iVar10 < (int)uVar5)) && (text[lVar8 + (-1 - uVar13)] == ' '))
             && (lVar8 = lVar8 + 1, text[lVar8 - uVar13] == ' ')) {
            iVar7 = iVar7 + -1;
            text[lVar8 - uVar13] = '\0';
            iVar11 = (int)lVar8;
          }
          uVar1 = iVar7 + 1;
          uVar14 = (ulong)uVar1;
          text[(long)iVar7 - uVar13] = cVar2;
          iVar10 = iVar11 + 1;
        } while (iVar11 < (int)uVar5);
        uVar4 = (uint)(uVar1 != 0);
        if (0 < iVar7) {
          lVar8 = 3;
          uVar4 = (uint)(uVar1 != 0);
          do {
            if (((text[lVar8 + (-3 - uVar13)] == ' ') && (text[lVar8 + (-2 - uVar13)] == '\'')) &&
               ((lVar8 - 1U < uVar14 && (bVar3 = text[lVar8 + (-1 - uVar13)], (bVar3 & 0xef) != 100)
                ))) {
              if ((bVar3 == 0x73) || (bVar3 == 0x6d)) {
                uVar4 = uVar4 - 1;
              }
              else if (((int)lVar8 <= iVar7) && ((bVar3 != 0x6c || (text[lVar8 - uVar13] != 'l'))))
              {
                uVar4 = uVar4 - ((bVar3 & 0xfb) == 0x72 && text[lVar8 - uVar13] == 'e');
              }
            }
            lVar12 = (long)(int)uVar4;
            uVar4 = uVar4 + 1;
            text[lVar12 - uVar13] = text[lVar8 + (-2 - uVar13)];
            lVar12 = lVar8 - uVar14;
            lVar8 = lVar8 + 1;
          } while (lVar12 != 1);
        }
        goto LAB_00217b12;
      }
    }
    uVar4 = (uint)(uVar4 != 0);
  }
LAB_00217b12:
  uVar5 = -uVar4;
  if ((int)uVar4 <= text_len_max) {
    uVar5 = uVar4;
  }
  return uVar5;
}

Assistant:

int32_t llama_vocab::impl::detokenize(
               const llama_token * tokens,
                         int32_t   n_tokens,
                            char * text,
                         int32_t   text_len_max,
                            bool   remove_special,
                            bool   unparse_special) const {
    if (type == LLAMA_VOCAB_TYPE_NONE) {
        return 0;
    }

    GGML_ASSERT(tokenizer && "Tokenizer not initialized. Call llama_vocab::init_tokenizer() first.");

    int32_t avail = text_len_max;
    int32_t total = 0;

    // remove the leading space
    bool remove_space = add_space_prefix;

    if (remove_special && add_bos) {
        if (n_tokens > 0 && tokens[0] == special_bos_id) {
            remove_space = false;
            n_tokens--;
            tokens++;
        }
    }

    if (remove_special && add_eos) {
        if (n_tokens > 0 && tokens[n_tokens - 1] == special_eos_id) {
            n_tokens--;
        }
    }

    for (int32_t i = 0; i < n_tokens; ++i) {
        GGML_ASSERT(avail >= 0);
        int32_t n_chars = token_to_piece(tokens[i], text, avail, remove_space, unparse_special);
        remove_space = false;
        if (n_chars < 0) {
            avail = 0;
            total -= n_chars;
        } else if (n_chars > 0) {
            avail -= n_chars;
            text  += n_chars;
            total += n_chars;
        }
    }

    if (total > text_len_max) {
        return -total;
    }

    if (clean_spaces) {
        text -= total;  // restart text

        // first pass: characters ?!.,  //TODO: where do these characters come from?
        const int32_t total1 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total1; ++i) {
            const char x = text[i];
            if (text[i - 1] == ' ') {
                if (x == '?' || x == '!' || x == '.' || x == ',') {  // " ?", " !", " .", " ,"
                    total--;  // remove space
                }
            }
            text[total++] = x;
        }

        // second pass: strip single apostrophe between spaces
        const int32_t total2 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total2; ++i) {
            const char x = text[i];
            if (x == '\'' && i + 1 < total2 && text[i - 1] == ' ' && text[i + 1] == ' ') {  // " ' "
                total--;           // remove prev space
                text[++i] = '\0';  // remove next space
            }
            text[total++] = x;
        }

        // third pass: apostrophe contractions  //NOTE: this makes sense?
        const int32_t total3 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total3; ++i) {
            const char x = text[i];
            if (text[i - 1] == ' ') {
                if (x == '\'' && i + 1 < total3) {
                    const char x1 = text[i + 1];
                    if (x1 == 't' || x1 == 'd') {  // " 't", " 'd"
                        //total--;  // remove space
                    } else if (x1 == 's' || x1 == 'm') {  // " 's", " 'm"
                        total--;  // remove space
                    } else if (i + 2 < total3) {
                        const char x2 = text[i + 2];
                        if ((x1 == 'l' && x2 == 'l')) {  // " 'll"
                            //total--;  // remove space
                        } else if ((x1 == 'r' && x2 == 'e') || (x1 == 'v' && x2 == 'e')) {  // " 're", " 've"
                            total--;  // remove space
                        } else {
                            //total--;  // remove space
                        }
                    } else {
                        //total--;  // remove space
                    }
                }
            }
            text[total++] = x;
        }
    }

    return total <= text_len_max ? total : -total;
}